

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O3

void MapOptHandler_fs_nocheckposition(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FFsOptions *pFVar2;
  bool bVar3;
  FName local_14;
  
  FName::NameManager::FindName(&FName::NameData,"fragglescript",false);
  pFVar2 = level_info_t::GetOptData<FFsOptions>(info,&local_14,true);
  bVar1 = FMapInfoParser::CheckAssign(parse);
  bVar3 = true;
  if (bVar1) {
    FScanner::MustGetNumber(&parse->sc);
    bVar3 = (parse->sc).Number != 0;
  }
  (pFVar2->super_FOptionalMapinfoData).field_0x14 = bVar3;
  return;
}

Assistant:

DEFINE_MAP_OPTION(fs_nocheckposition, false)
{
	FFsOptions *opt = info->GetOptData<FFsOptions>("fragglescript");

	if (parse.CheckAssign())
	{
		parse.sc.MustGetNumber();
		opt->nocheckposition = !!parse.sc.Number;
	}
	else
	{
		opt->nocheckposition = true;
	}
}